

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O1

void optionhelp(TidyDoc tdoc)

{
  ctmbstr ptVar1;
  ctmbstr ptVar2;
  ctmbstr ptVar3;
  
  putchar(10);
  ptVar1 = tidyLocalizedString(0x358);
  printf(anon_var_dwarf_1a594 + 0x16,ptVar1);
  ptVar1 = tidyLocalizedString(0x359);
  ptVar2 = tidyLocalizedString(0x35a);
  ptVar3 = tidyLocalizedString(0x35b);
  printf("%-27.27s %-9.9s  %-40.40s\n",ptVar1,ptVar2,ptVar3);
  printf("%-27.27s %-9.9s  %-40.40s\n",
         "=================================================================",
         "=================================================================");
  ForEachSortedOption(tdoc,printOption);
  return;
}

Assistant:

static void optionhelp( TidyDoc tdoc )
{
    printf( "\n" );
    printf( "%s", tidyLocalizedString( TC_TXT_HELP_CONFIG ) );

    printf( fmt,
           tidyLocalizedString( TC_TXT_HELP_CONFIG_NAME ),
           tidyLocalizedString( TC_TXT_HELP_CONFIG_TYPE ),
           tidyLocalizedString( TC_TXT_HELP_CONFIG_ALLW ) );

    printf( fmt, ul, ul, ul );

    ForEachSortedOption( tdoc, printOption );
}